

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::shl(SVInt *this,bitwidth_t amount)

{
  bitwidth_t bVar1;
  byte bVar2;
  bool isSigned;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint64_t value;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  SVIntStorage *other;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  SVInt SVar7;
  
  other = (SVIntStorage *)CONCAT44(in_register_00000034,amount);
  if (in_EDX == 0) {
    SVInt(this,other);
    uVar3 = extraout_RDX_00;
  }
  else {
    uVar6 = other->bitWidth;
    if (in_EDX < uVar6) {
      bVar2 = (byte)in_EDX;
      if (0x40 < uVar6 || (other->unknownFlag & 1U) != 0) {
        allocUninitialized(this,uVar6,other->signFlag,(bool)(other->unknownFlag & 1));
        if ((in_EDX < 0x40) && (other->unknownFlag == false)) {
          bVar1 = other->bitWidth;
          uVar5 = 0;
          for (uVar4 = 0; bVar1 + 0x3f >> 6 != uVar4; uVar4 = uVar4 + 1) {
            (this->super_SVIntStorage).field_0.pVal[uVar4] =
                 (other->field_0).pVal[uVar4] << (bVar2 & 0x3f) | uVar5;
            uVar5 = (other->field_0).pVal[uVar4] >> (0x40 - bVar2 & 0x3f);
          }
        }
        else {
          uVar6 = other->bitWidth + 0x3f >> 6;
          shlFar((this->super_SVIntStorage).field_0.pVal,(other->field_0).pVal,in_EDX & 0x3f,
                 in_EDX >> 6,0,uVar6);
          if (other->unknownFlag == true) {
            shlFar((this->super_SVIntStorage).field_0.pVal,(other->field_0).pVal,in_EDX & 0x3f,
                   in_EDX >> 6,uVar6,uVar6);
          }
        }
        clearUnusedBits(this);
        checkUnknown(this);
        uVar3 = extraout_RDX;
        goto LAB_00188f8d;
      }
      value = (other->field_0).val << (bVar2 & 0x3f);
      isSigned = other->signFlag;
    }
    else {
      isSigned = other->signFlag;
      value = 0;
    }
    SVInt(this,uVar6,value,isSigned);
    uVar3 = extraout_RDX_01;
  }
LAB_00188f8d:
  SVar7.super_SVIntStorage.bitWidth = (int)uVar3;
  SVar7.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar3 >> 0x20);
  SVar7.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar3 >> 0x28);
  SVar7.super_SVIntStorage._14_2_ = (short)((ulong)uVar3 >> 0x30);
  SVar7.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar7.super_SVIntStorage;
}

Assistant:

SVInt SVInt::shl(bitwidth_t amount) const {
    // handle trivial cases
    if (amount == 0)
        return *this;
    if (amount >= bitWidth) // if the shift amount is too large, we end up with zero anyway
        return SVInt(bitWidth, 0, signFlag);
    if (isSingleWord())
        return SVInt(bitWidth, val << amount, signFlag);

    // handle the small shift case
    SVInt result = allocUninitialized(bitWidth, signFlag, unknownFlag);
    if (amount < BITS_PER_WORD && !unknownFlag) {
        uint64_t carry = 0;
        for (uint32_t i = 0; i < getNumWords(); i++) {
            result.pVal[i] = pVal[i] << amount | carry;
            carry = pVal[i] >> (BITS_PER_WORD - amount);
        }
    }
    else {
        // otherwise do a full shift
        uint32_t numWords = getNumWords(bitWidth, false);
        uint32_t wordShift = amount % BITS_PER_WORD;
        uint32_t offset = amount / BITS_PER_WORD;

        // also handle shifting the unknown bits if necessary
        shlFar(result.pVal, pVal, wordShift, offset, 0, numWords);
        if (unknownFlag)
            shlFar(result.pVal, pVal, wordShift, offset, numWords, numWords);
    }

    result.clearUnusedBits();
    result.checkUnknown();
    return result;
}